

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::
unordered_flat_map<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
::~unordered_flat_map
          (unordered_flat_map<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
           *this)

{
  value_type_pointer p;
  
  p = (this->table_).
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
      .arrays.elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(((this->table_).
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
                        .arrays.groups_size_mask * 0xc40 + 0xc40) / 0xd0) * 0xd0);
    return;
  }
  return;
}

Assistant:

~unordered_flat_map() = default;